

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.h
# Opt level: O2

bool QObject::disconnect<void(QDockWidgetGroupWindow::*)(),void(QMainWindowLayout::*)()>
               (Object *sender,offset_in_QDockWidgetGroupWindow_to_subr signal,Object *receiver,
               offset_in_QMainWindowLayout_to_subr slot)

{
  undefined1 uVar1;
  long in_FS_OFFSET;
  void *local_28 [2];
  void *local_18;
  Object *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (void *)signal;
  local_10 = receiver;
  uVar1 = QObject::disconnectImpl
                    ((QObject *)sender,&local_18,(QObject *)slot,local_28,
                     &QDockWidgetGroupWindow::staticMetaObject);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

static inline bool disconnect(const typename QtPrivate::FunctionPointer<Func1>::Object *sender, Func1 signal,
                                  const typename QtPrivate::FunctionPointer<Func2>::Object *receiver, Func2 slot)
    {
        typedef QtPrivate::FunctionPointer<Func1> SignalType;
        typedef QtPrivate::FunctionPointer<Func2> SlotType;

        static_assert(QtPrivate::HasQ_OBJECT_Macro<typename SignalType::Object>::Value,
                          "No Q_OBJECT in the class with the signal");

        //compilation error if the arguments does not match.
        static_assert((QtPrivate::CheckCompatibleArguments<typename SignalType::Arguments, typename SlotType::Arguments>::value),
                          "Signal and slot arguments are not compatible.");

        return disconnectImpl(sender, reinterpret_cast<void **>(&signal), receiver, reinterpret_cast<void **>(&slot),
                              &SignalType::Object::staticMetaObject);
    }